

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O2

void __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FreePage(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,Page *page)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  
  if (this->inDtor == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x3c8,"(inDtor)","inDtor");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  Heap<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper>::EnsurePageReadWrite<4u>
            ((Heap<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper> *)this,page);
  BVar3 = BVUnitT<unsigned_long>::Count(&page->freeBitVector);
  if (DAT_0145948a == '\x01') {
    Output::Trace(CustomHeapPhase,L"Removing page in bucket %d, freeSpace: %d\n",
                  (ulong)(uint)page->currentBucket,(ulong)(BVar3 << 7));
  }
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  ReleasePages(this->codePageAllocators,page->address,1,page->segment);
  this->freeObjectSize = this->freeObjectSize - (ulong)(BVar3 << 7);
  this->totalAllocationSize = this->totalAllocationSize - 0x1000;
  return;
}

Assistant:

void Heap<TAlloc, TPreReservedAlloc>::FreePage(Page* page)
{
    // CodePageAllocators is locked in FreeAll
    Assert(inDtor);
    DWORD pageSize = AutoSystemInfo::PageSize;
    EnsurePageWriteable(page);
    size_t freeSpace = page->freeBitVector.Count() * Page::Alignment;

    VerboseHeapTrace(_u("Removing page in bucket %d, freeSpace: %d\n"), page->currentBucket, freeSpace);
    this->codePageAllocators->ReleasePages(page->address, 1, page->segment);

#if DBG_DUMP
    this->freeObjectSize -= freeSpace;
    this->totalAllocationSize -= pageSize;
#endif
}